

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf.cc
# Opt level: O2

bool __thiscall
bloaty::anon_unknown_0::ElfObjectFile::GetDisassemblyInfo
          (ElfObjectFile *this,string_view symbol,DataSource symbol_source,DisassemblyInfo *info)

{
  _Rb_tree_header *p_Var1;
  InputFile *pIVar2;
  _Base_ptr addr;
  _Base_ptr off;
  bool bVar3;
  iterator iVar4;
  DualMap *translator;
  initializer_list<bloaty::RangeSink_*> __l;
  string_view data;
  string_view format;
  string_view sVar5;
  string_view symbol_local;
  NameMunger empty_munger;
  uint64_t fileoff;
  vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_> sink_ptrs;
  string local_3f0;
  SymbolTable symbol_table;
  DualMap base_map;
  Options local_340;
  RangeSink symbol_sink;
  RangeSink base_sink;
  
  symbol_local._M_str = symbol._M_str;
  symbol_local._M_len = symbol._M_len;
  base_map.vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &base_map.vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header;
  base_map.vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  base_map.vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  base_map.vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  base_map.file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &base_map.file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header;
  base_map.file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  base_map.file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  base_map.file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  empty_munger.regexes_.
  super__Vector_base<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  empty_munger.regexes_.
  super__Vector_base<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  empty_munger.regexes_.
  super__Vector_base<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar2 = (this->super_ObjectFile).file_data_._M_t.
           super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>._M_t.
           super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>.
           super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl;
  base_map.vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       base_map.vm_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  base_map.file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       base_map.file_map.mappings_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Options::Options((Options *)&symbol_sink);
  RangeSink::RangeSink
            (&base_sink,pIVar2,(Options *)&symbol_sink,kSegments,(DualMap *)0x0,(Arena *)0x0);
  Options::~Options((Options *)&symbol_sink);
  RangeSink::AddOutput(&base_sink,&base_map,&empty_munger);
  __l._M_len = 1;
  __l._M_array = (iterator)&symbol_sink;
  symbol_sink.file_ = (InputFile *)&base_sink;
  std::vector<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>::vector
            (&sink_ptrs,__l,(allocator_type *)&local_340);
  (*(this->super_ObjectFile)._vptr_ObjectFile[3])(this,&sink_ptrs);
  p_Var1 = &symbol_table._M_t._M_impl.super__Rb_tree_header;
  symbol_table._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  symbol_table._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  symbol_table._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pIVar2 = (this->super_ObjectFile).file_data_._M_t.
           super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>._M_t.
           super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>.
           super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl;
  symbol_table._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  symbol_table._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  Options::Options(&local_340);
  translator = &base_map;
  RangeSink::RangeSink(&symbol_sink,pIVar2,&local_340,symbol_source,translator,(Arena *)0x0);
  Options::~Options(&local_340);
  RangeSink::AddOutput(&symbol_sink,&info->symbol_map,&empty_munger);
  ReadELFSymbols((anon_unknown_0 *)
                 (((this->super_ObjectFile).debug_file_)->file_data_)._M_t.
                 super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>
                 .super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl,
                 (InputFile *)&symbol_sink,(RangeSink *)&symbol_table,(SymbolTable *)0x0,
                 SUB81(translator,0));
  iVar4 = std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
          ::find(&symbol_table._M_t,&symbol_local);
  if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
    sVar5._M_str._0_4_ = symbol_source;
    sVar5._M_len = (size_t)symbol_local._M_str;
    sVar5._M_str._4_4_ = 0;
    ItaniumDemangle_abi_cxx11_
              ((string *)&local_340,(bloaty *)symbol_local._M_len,sVar5,(DataSource)translator);
    local_3f0._M_dataplus._M_p =
         (pointer)local_340._internal_metadata_.
                  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                  .ptr_;
    local_3f0._M_string_length =
         (size_type)local_340.super_Message.super_MessageLite._vptr_MessageLite;
    iVar4 = std::
            _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
            ::find(&symbol_table._M_t,(key_type *)&local_3f0);
    std::__cxx11::string::~string((string *)&local_340);
    if ((_Rb_tree_header *)iVar4._M_node == p_Var1) {
      bVar3 = false;
      goto LAB_0018baf4;
    }
  }
  addr = iVar4._M_node[1]._M_left;
  off = iVar4._M_node[1]._M_right;
  bVar3 = RangeMap::Translate(&base_map.vm_map,(uint64_t)addr,&fileoff);
  if (!bVar3) {
    absl::substitute_internal::Arg::Arg((Arg *)&local_340,&symbol_local);
    format._M_str = (char *)&local_340;
    format._M_len = (size_t)"Couldn\'t translate VM address for function $0";
    absl::Substitute_abi_cxx11_(&local_3f0,(absl *)0x2d,format,(Arg *)translator);
    Throw(local_3f0._M_dataplus._M_p,0x57f);
  }
  pIVar2 = (this->super_ObjectFile).file_data_._M_t.
           super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>._M_t.
           super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>.
           super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl;
  data._M_str = (char *)fileoff;
  data._M_len = (size_t)(pIVar2->data_)._M_str;
  sVar5 = StrictSubstr((bloaty *)(pIVar2->data_)._M_len,data,(size_t)off,(size_t)translator);
  info->text = sVar5;
  info->start_address = (uint64_t)addr;
  bVar3 = ReadElfArchMode((this->super_ObjectFile).file_data_._M_t.
                          super___uniq_ptr_impl<bloaty::InputFile,_std::default_delete<bloaty::InputFile>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_bloaty::InputFile_*,_std::default_delete<bloaty::InputFile>_>
                          .super__Head_base<0UL,_bloaty::InputFile_*,_false>._M_head_impl,
                          &info->arch,&info->mode);
LAB_0018baf4:
  RangeSink::~RangeSink(&symbol_sink);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_unsigned_long>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_unsigned_long>_>_>_>
  ::~_Rb_tree(&symbol_table._M_t);
  std::_Vector_base<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>::~_Vector_base
            (&sink_ptrs.
              super__Vector_base<bloaty::RangeSink_*,_std::allocator<bloaty::RangeSink_*>_>);
  RangeSink::~RangeSink(&base_sink);
  std::
  vector<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::unique_ptr<bloaty::ReImpl,_std::default_delete<bloaty::ReImpl>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&empty_munger.regexes_);
  DualMap::~DualMap(&base_map);
  return bVar3;
}

Assistant:

bool GetDisassemblyInfo(const std::string_view symbol,
                          DataSource symbol_source,
                          DisassemblyInfo* info) const override {
    return DoGetDisassemblyInfo(&symbol, symbol_source, info);
  }